

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigFlagsTable.h
# Opt level: O2

void __thiscall
Js::RangeBase<int>::Add(RangeBase<int> *this,int i,int j,RangeBase<int> *oppositeRange)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Type *pTVar4;
  int iVar5;
  int iVar6;
  undefined1 local_60 [8];
  EditingIterator it;
  RangeUnit<int> a;
  Unit lowUnit;
  Unit topUnit;
  
  it.super_EditingIterator.last._0_4_ = i;
  it.super_EditingIterator.last._4_4_ = j;
  SList<Js::RangeUnit<int>,_Memory::NoCheckHeapAllocator,_RealCount>::Prepend
            (&this->range,(RangeUnit<int> *)&it.super_EditingIterator.last);
  if (oppositeRange != (RangeBase<int> *)0x0) {
    if ((RangeBase<int> *)
        (oppositeRange->range).
        super_SListBase<Js::RangeUnit<int>,_Memory::NoCheckHeapAllocator,_RealCount>.
        super_SListNodeBase<Memory::NoCheckHeapAllocator>.next == oppositeRange) {
      local_60._0_4_ = -0x80000000;
      local_60._4_4_ = 0x7fffffff;
      SList<Js::RangeUnit<int>,_Memory::NoCheckHeapAllocator,_RealCount>::Prepend
                (&oppositeRange->range,(RangeUnit<int> *)local_60);
    }
    it.super_EditingIterator.super_Iterator.current = (NodeBase *)0x0;
    local_60 = (undefined1  [8])oppositeRange;
    it.super_EditingIterator.super_Iterator.list =
         (SListBase<Js::RangeUnit<int>,_Memory::NoCheckHeapAllocator,_RealCount> *)oppositeRange;
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
switchD_0034709c_caseD_0:
    bVar2 = SListBase<Js::RangeUnit<int>,_Memory::NoCheckHeapAllocator,_RealCount>::EditingIterator
            ::Next((EditingIterator *)local_60);
    if (bVar2) {
      pTVar4 = SListBase<Js::RangeUnit<int>,_Memory::NoCheckHeapAllocator,_RealCount>::Iterator::
               Data((Iterator *)local_60);
      iVar5 = (*pTVar4).i;
      iVar6 = (*pTVar4).j;
      switch((i <= iVar6 && iVar5 <= i) + (j <= iVar6 && iVar5 <= j) * '\x02' +
             (iVar5 <= it.super_EditingIterator.last._4_4_ &&
             (int)it.super_EditingIterator.last <= iVar5) * '\x04' +
             (iVar6 <= it.super_EditingIterator.last._4_4_ &&
             (int)it.super_EditingIterator.last <= iVar6) * '\b') {
      case '\0':
        break;
      default:
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ConfigFlagsTable.h"
                                    ,0x3c4,"((0))","UNREACHED");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
        break;
      case '\x03':
        a.j = (int)it.super_EditingIterator.last + -1;
        a.i = iVar5;
        lowUnit.j = (*pTVar4).j;
        lowUnit.i = it.super_EditingIterator.last._4_4_ + 1;
        SList<Js::RangeUnit<int>,_Memory::NoCheckHeapAllocator,_RealCount>::EditingIterator::
        InsertBefore((EditingIterator *)local_60,&a);
        SList<Js::RangeUnit<int>,_Memory::NoCheckHeapAllocator,_RealCount>::EditingIterator::
        InsertBefore((EditingIterator *)local_60,&lowUnit);
      case '\f':
      case '\r':
      case '\x0e':
      case '\x0f':
        SList<Js::RangeUnit<int>,_Memory::NoCheckHeapAllocator,_RealCount>::EditingIterator::
        RemoveCurrent((EditingIterator *)local_60);
        break;
      case '\x06':
      case '\a':
        pTVar4->i = it.super_EditingIterator.last._4_4_ + 1;
        break;
      case '\t':
      case '\v':
        pTVar4->j = (int)it.super_EditingIterator.last + -1;
      }
      goto switchD_0034709c_caseD_0;
    }
  }
  return;
}

Assistant:

void
RangeBase<TRangeUnitData>::Add(TRangeUnitData i, TRangeUnitData j, RangeBase<TRangeUnitData>* oppositeRange)
{
    RangeUnit<TRangeUnitData> a(i, j);
    range.Prepend(a);
    if (oppositeRange)
    {
        if (oppositeRange->range.Empty())
        {
            oppositeRange->range.Prepend(GetFullRange<TRangeUnitData>());
        }
        // Do an intersection
        auto it = oppositeRange->range.GetEditingIterator();
        while (it.Next())
        {
            Unit& unit = it.Data();
            bool c1 = RangeUnitContains(unit, i);
            bool c2 = RangeUnitContains(unit, j);
            bool c3 = RangeUnitContains(a, unit.i);
            bool c4 = RangeUnitContains(a, unit.j);
            enum IntersectionCase
            {
                NoIntersection = 0,
                AddedFullyContained = 3, // [ u [a] ]
                IntersectionAdded_Unit = 6, // [ a [ ] u ]
                CommonLowBound_Unit = 7, // [[ a ] u ]
                IntersectionUnit_Added = 9, // [ u [ ] a ]
                CommonTopBound_Unit = 11, // [ u [ a ]]
                UnitFullyContained = 12, // [ a [u] ]
                CommonLowBound_Added = 13, // [[ u ] a ]
                CommonTopBound_Added = 14, // [ a [ u ]]
                FullIntersection = 15 // [[a, u]]
            };
            IntersectionCase intersectionCase = (IntersectionCase)((int)c1 | (c2 << 1) | (c3 << 2) | (c4 << 3));
            switch (intersectionCase)
            {
            case NoIntersection:
                // Nothing to do
                break;
            case AddedFullyContained:
            {
                // Need to break the current in 2
                Unit lowUnit = unit;
                Unit topUnit = unit;
                lowUnit.j = GetPrevious(a.i);
                topUnit.i = GetNext(a.j);
                it.InsertBefore(lowUnit);
                it.InsertBefore(topUnit);
                it.RemoveCurrent();
                break;
            }
            case IntersectionAdded_Unit:
            case CommonLowBound_Unit:
                // Move the unit lower bound after the added upper bound
                unit.i = GetNext(a.j);
                break;
            case IntersectionUnit_Added:
            case CommonTopBound_Unit:
                // Move the unit upper bound before the added lower bound
                unit.j = GetPrevious(a.i);
                break;
            case CommonTopBound_Added:
            case CommonLowBound_Added:
            case UnitFullyContained:
            case FullIntersection:
                // Remove the unit
                it.RemoveCurrent();
                break;
            default:
                Assert(UNREACHED);
                break;
            }
        }
    }
}